

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O3

void Acb_NtkPrintPaths(Acb_Ntk_t *p)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  
  iVar1 = (p->vObjType).nSize;
  if (1 < iVar1) {
    uVar3 = 1;
    do {
      lVar2 = (long)iVar1;
      if (lVar2 <= (long)uVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      if ((p->vObjType).pArray[uVar3] != '\0') {
        printf("Obj = %5d :   ",uVar3 & 0xffffffff);
        if ((long)(p->vLevelD).nSize <= (long)uVar3) {
LAB_00384db8:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        printf("LevelD = %5d  ",(ulong)(uint)(p->vLevelD).pArray[uVar3]);
        if ((long)(p->vLevelR).nSize <= (long)uVar3) goto LAB_00384db8;
        printf("LevelR = %5d    ",(ulong)(uint)(p->vLevelR).pArray[uVar3]);
        if ((long)(p->vPathD).nSize <= (long)uVar3) goto LAB_00384db8;
        printf("PathD = %5d  ",(ulong)(uint)(p->vPathD).pArray[uVar3]);
        if ((long)(p->vPathR).nSize <= (long)uVar3) goto LAB_00384db8;
        printf("PathR = %5d    ",(ulong)(uint)(p->vPathR).pArray[uVar3]);
        if (((long)(p->vPathD).nSize <= (long)uVar3) || ((long)(p->vPathR).nSize <= (long)uVar3))
        goto LAB_00384db8;
        printf("Paths = %5d  ",(ulong)(uint)((p->vPathR).pArray[uVar3] * (p->vPathD).pArray[uVar3]))
        ;
        putchar(10);
        iVar1 = (p->vObjType).nSize;
        lVar2 = (long)iVar1;
      }
      uVar3 = uVar3 + 1;
    } while ((long)uVar3 < lVar2);
  }
  return;
}

Assistant:

void Acb_NtkPrintPaths( Acb_Ntk_t * p )
{
    int iObj;
    Acb_NtkForEachObj( p, iObj )
    {
        printf( "Obj = %5d :   ",   iObj );
        printf( "LevelD = %5d  ",   Acb_ObjLevelD(p, iObj) );
        printf( "LevelR = %5d    ", Acb_ObjLevelR(p, iObj) );
        printf( "PathD = %5d  ",    Acb_ObjPathD(p, iObj) );
        printf( "PathR = %5d    ",  Acb_ObjPathR(p, iObj) );
        printf( "Paths = %5d  ",    Acb_ObjPathD(p, iObj) * Acb_ObjPathR(p, iObj) );
        printf( "\n" );
    }
}